

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImGuiTabItem * ImGui::TabBarFindTabByID(ImGuiTabBar *tab_bar,ImGuiID tab_id)

{
  ImGuiTabItem *pIVar1;
  ImGuiTabItem *pIVar2;
  ulong uVar3;
  ImGuiTabItem *in_RAX;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (tab_id != 0) {
    uVar4 = (ulong)(tab_bar->Tabs).Size;
    bVar6 = 0 < (long)uVar4;
    if ((0 < (long)uVar4) && (in_RAX = (tab_bar->Tabs).Data, in_RAX->ID != tab_id)) {
      uVar3 = 1;
      do {
        uVar5 = uVar3;
        if (uVar4 == uVar5) {
          bVar6 = uVar5 < uVar4;
          goto LAB_00229d12;
        }
        pIVar1 = in_RAX + 1;
        pIVar2 = in_RAX + 1;
        in_RAX = pIVar1;
        uVar3 = uVar5 + 1;
      } while (pIVar2->ID != tab_id);
      bVar6 = uVar5 < uVar4;
    }
LAB_00229d12:
    if (bVar6) {
      return in_RAX;
    }
  }
  return (ImGuiTabItem *)0x0;
}

Assistant:

ImGuiTabItem* ImGui::TabBarFindTabByID(ImGuiTabBar* tab_bar, ImGuiID tab_id)
{
    if (tab_id != 0)
        for (int n = 0; n < tab_bar->Tabs.Size; n++)
            if (tab_bar->Tabs[n].ID == tab_id)
                return &tab_bar->Tabs[n];
    return NULL;
}